

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O1

bool DerBase::DecodeSetOrSequenceOf<SignerInfo>
               (DerType type,uchar *pIn,size_t cbIn,size_t *cbPrefix,size_t *cbSize,
               vector<SignerInfo,_std::allocator<SignerInfo>_> *out)

{
  SignerInfo *pSVar1;
  SignerInfo *pSVar2;
  size_t sVar3;
  bool bVar4;
  pointer pAVar5;
  overflow_error *this;
  ulong uVar6;
  SignerInfo *this_00;
  pointer pAVar7;
  undefined1 local_230 [8];
  SignerInfo t;
  size_t local_68;
  size_t cbElement;
  vector<SignerInfo,_std::allocator<SignerInfo>_> *local_58;
  size_t *local_50;
  size_t *local_48;
  undefined **local_40;
  bool local_31 [8];
  bool isNull;
  
  local_31[0] = false;
  pSVar1 = *(SignerInfo **)out;
  pSVar2 = *(SignerInfo **)(out + 8);
  this_00 = pSVar1;
  cbElement = (size_t)pIn;
  local_58 = out;
  local_50 = cbSize;
  local_48 = cbPrefix;
  if (pSVar2 != pSVar1) {
    do {
      SignerInfo::~SignerInfo(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
    *(SignerInfo **)(local_58 + 8) = pSVar1;
  }
  bVar4 = DecodeSequenceOrSet(type,(uchar *)cbElement,cbIn,local_48,local_50,local_31);
  local_40 = (undefined **)(ulong)bVar4;
  if (bVar4) {
    uVar6 = 2;
    if (local_31[0] == false) {
      pAVar7 = (pointer)*local_48;
      t.unsignedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(pAVar7->super_DerBase)._vptr_DerBase + *local_50);
      local_40 = &PTR_EncodedSize_00151a70;
      do {
        local_68 = 0;
        t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        local_230 = (undefined1  [8])&PTR_EncodedSize_00151068;
        t.version.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151ab8;
        t.version.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.version.super_DerBase.cbData = 0;
        t.version.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.sid.super_ChoiceType.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.sid.super_ChoiceType.value.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.sid.super_ChoiceType.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151828;
        t.sid.super_ChoiceType.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.sid.super_ChoiceType.value.super_DerBase.cbData = 0;
        t.sid.super_ChoiceType.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.sid.super_ChoiceType.value.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x30000001f;
        t.sid.super_ChoiceType.derType.type._0_1_ = Boolean;
        t.version.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151728;
        t.digestAlgorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.sid.super_ChoiceType._64_8_ = &PTR_EncodedSize_001503b8;
        t.digestAlgorithm.algorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.digestAlgorithm.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151908;
        t.digestAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.digestAlgorithm.algorithm.super_DerBase.cbData = 0;
        t.digestAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.digestAlgorithm.parameters.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.digestAlgorithm.algorithm.oidIndex = (size_t)&PTR_EncodedSize_00151828;
        t.signedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.signedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.digestAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.digestAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        t.digestAlgorithm.parameters.super_DerBase.cbData = 0;
        t.digestAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.signatureAlgorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_001503b8;
        t.signatureAlgorithm.algorithm.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signatureAlgorithm.super_DerBase.cbData = (size_t)&PTR_EncodedSize_00151908;
        t.signatureAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signatureAlgorithm.algorithm.super_DerBase.cbData = 0;
        t.signatureAlgorithm.algorithm.value.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.signatureAlgorithm.parameters.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signatureAlgorithm.algorithm.oidIndex = (size_t)&PTR_EncodedSize_00151828;
        t.signatureAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signatureAlgorithm.parameters.super_DerBase.cbData = 0;
        t.signatureAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.signature.super_DerBase._vptr_DerBase = (_func_int **)0x0;
        t.signatureAlgorithm.parameters.encodedValue.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&PTR_EncodedSize_00151a70;
        t.unsignedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        t.unsignedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signature.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        t.signature.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        t.signature.super_DerBase.cbData = 0;
        t.signature.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        if (t.unsignedAttrs.super__Vector_base<Attribute,_std::allocator<Attribute>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < pAVar7) {
          this = (overflow_error *)__cxa_allocate_exception(0x10);
          std::overflow_error::overflow_error(this,"Integer overflow");
          __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
        }
        bVar4 = SignerInfo::Decode((SignerInfo *)local_230,
                                   (uchar *)((long)&(pAVar7->super_DerBase)._vptr_DerBase +
                                            cbElement),
                                   (long)t.unsignedAttrs.
                                         super__Vector_base<Attribute,_std::allocator<Attribute>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pAVar7,&local_68);
        sVar3 = local_68;
        if (bVar4) {
          std::vector<SignerInfo,_std::allocator<SignerInfo>_>::push_back
                    (local_58,(value_type *)local_230);
          pAVar7 = (pointer)((long)&(pAVar7->super_DerBase)._vptr_DerBase + sVar3);
          pAVar5 = (pointer)(*local_48 + *local_50);
          bVar4 = pAVar7 != pAVar5;
          local_40 = (undefined **)
                     CONCAT71((int7)((ulong)pAVar5 >> 8),pAVar7 == pAVar5 | (byte)local_40);
        }
        else {
          if (local_68 == 0) {
            *local_48 = 0;
            *local_50 = 0;
          }
          local_40 = (undefined **)0x0;
          bVar4 = false;
        }
        SignerInfo::~SignerInfo((SignerInfo *)local_230);
      } while (bVar4);
      goto LAB_001355d8;
    }
  }
  else {
    uVar6 = 0;
  }
  *local_48 = uVar6;
  *local_50 = 0;
LAB_001355d8:
  return (bool)((byte)local_40 & 1);
}

Assistant:

static bool DecodeSetOrSequenceOf(DerType type, const unsigned char* pIn, size_t cbIn, size_t& cbPrefix, size_t& cbSize, std::vector<T>& out)
	{
		bool isNull = false;
		size_t offset = 0;

		out.clear();

		if (!DecodeSequenceOrSet(type, pIn, cbIn, cbPrefix, cbSize, isNull))
		{
			cbPrefix = 0;
			cbSize = 0;
			return false;
		}

		if (isNull)
		{
			cbPrefix = 2;
			cbSize = 0;
			return true;
		}

		offset = cbPrefix;
        cbIn = cbPrefix + cbSize;

		for (;;)
		{
			size_t cbElement = 0;
			T t;

			if (offset > cbIn)
				throw std::overflow_error("Integer overflow");

			if (!t.Decode(pIn + offset, cbIn - offset, cbElement))
			{
				// Accomodate the case where we have to decode into the 
				// sequence to see if the element is optional
				if( cbElement == 0 )
				{
					cbPrefix = 0;
					cbSize = 0;
				}
				return false;
			}

			offset += cbElement;
			out.push_back(t);

			// Exit conditions - should have used all of our
			// incoming data, as long as everything is polite
			if (offset == cbSize + cbPrefix)
			{
				return true;
			}
		}
	}